

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O0

spv_diagnostic spvDiagnosticCreate(spv_position position,char *message)

{
  size_t sVar1;
  void *pvVar2;
  size_t length;
  spv_diagnostic diagnostic;
  char *message_local;
  spv_position position_local;
  
  position_local = (spv_position)operator_new(0x28);
  if (position_local == (spv_position)0x0) {
    position_local = (spv_position)0x0;
  }
  else {
    sVar1 = strlen(message);
    pvVar2 = operator_new__(sVar1 + 1);
    position_local[1].line = (size_t)pvVar2;
    if (position_local[1].line == 0) {
      if (position_local != (spv_position)0x0) {
        operator_delete(position_local,0x28);
      }
      position_local = (spv_position)0x0;
    }
    else {
      position_local->line = position->line;
      position_local->column = position->column;
      position_local->index = position->index;
      *(undefined1 *)&position_local[1].column = 0;
      memset((void *)position_local[1].line,0,sVar1 + 1);
      strcpy((char *)position_local[1].line,message);
    }
  }
  return (spv_diagnostic)position_local;
}

Assistant:

spv_diagnostic spvDiagnosticCreate(const spv_position position,
                                   const char* message) {
  spv_diagnostic diagnostic = new spv_diagnostic_t;
  if (!diagnostic) return nullptr;
  size_t length = strlen(message) + 1;
  diagnostic->error = new char[length];
  if (!diagnostic->error) {
    delete diagnostic;
    return nullptr;
  }
  diagnostic->position = *position;
  diagnostic->isTextSource = false;
  memset(diagnostic->error, 0, length);
  strcpy(diagnostic->error, message);
  return diagnostic;
}